

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,string *filename,bool noPolicyScope)

{
  string *in_path;
  bool bVar1;
  char *pcVar2;
  string *in_base;
  cmMessenger *messenger;
  undefined1 local_f0 [8];
  cmListFile listFile;
  IncludeScope incScope;
  string filenametoread;
  string local_80;
  allocator<char> local_49;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool noPolicyScope_local;
  string *filename_local;
  cmMakefile *this_local;
  
  local_21 = noPolicyScope;
  psStack_20 = filename;
  filename_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_PARENT_LIST_FILE",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_CURRENT_LIST_FILE",
             (allocator<char> *)(filenametoread.field_2._M_local_buf + 0xf));
  pcVar2 = GetDefinition(this,&local_80);
  AddDefinition(this,&local_48,pcVar2);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)(filenametoread.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  in_path = psStack_20;
  in_base = GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath((string *)&incScope.NoPolicyScope,in_path,in_base);
  IncludeScope::IncludeScope
            ((IncludeScope *)((long)&listFile.Filename.field_2 + 8),this,
             (string *)&incScope.NoPolicyScope,(bool)(local_21 & 1));
  cmListFile::cmListFile((cmListFile *)local_f0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile((cmListFile *)local_f0,pcVar2,messenger,&this->Backtrace);
  if (bVar1) {
    ReadListFile(this,(cmListFile *)local_f0,(string *)&incScope.NoPolicyScope);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      IncludeScope::Quiet((IncludeScope *)((long)&listFile.Filename.field_2 + 8));
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
  cmListFile::~cmListFile((cmListFile *)local_f0);
  IncludeScope::~IncludeScope((IncludeScope *)((long)&listFile.Filename.field_2 + 8));
  std::__cxx11::string::~string((string *)&incScope.NoPolicyScope);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::ReadDependentFile(const std::string& filename,
                                   bool noPolicyScope)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE",
                      this->GetDefinition("CMAKE_CURRENT_LIST_FILE"));
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    incScope.Quiet();
  }
  return true;
}